

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# STObject.cpp
# Opt level: O2

void __thiscall jbcoin::STObject::setFieldV256(STObject *this,SField *field,STVector256 *v)

{
  STVector256 local_40;
  
  STVector256::STVector256(&local_40,v);
  setFieldUsingSetValue<jbcoin::STVector256,jbcoin::STVector256>(this,field,&local_40);
  STVector256::~STVector256(&local_40);
  return;
}

Assistant:

void STObject::setFieldV256 (SField const& field, STVector256 const& v)
{
    setFieldUsingSetValue <STVector256> (field, v);
}